

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O2

ion_err_t linear_hash_update_bucket
                    (ion_fpos_t bucket_loc,linear_hash_bucket_t *bucket,
                    linear_hash_table_t *linear_hash)

{
  ion_err_t iVar1;
  int iVar2;
  size_t sVar3;
  
  if ((FILE *)linear_hash->database == (FILE *)0x0) {
    iVar1 = '\t';
  }
  else {
    iVar2 = fseek((FILE *)linear_hash->database,bucket_loc,0);
    iVar1 = '\r';
    if (iVar2 == 0) {
      sVar3 = fwrite(bucket,0x10,1,(FILE *)linear_hash->database);
      iVar1 = '\a';
      if (sVar3 == 1) {
        iVar1 = '\0';
      }
    }
  }
  return iVar1;
}

Assistant:

ion_err_t
linear_hash_update_bucket(
	ion_fpos_t				bucket_loc,
	linear_hash_bucket_t	*bucket,
	linear_hash_table_t		*linear_hash
) {
	/* check the file is open */
	if (NULL == linear_hash->database) {
		return err_file_open_error;
	}

	/* seek to end of file to append new bucket */
	if (0 != fseek(linear_hash->database, bucket_loc, SEEK_SET)) {
		return err_file_bad_seek;
	}

	/* write bucket data to file */
	if (1 != fwrite(bucket, sizeof(linear_hash_bucket_t), 1, linear_hash->database)) {
		return err_file_write_error;
	}

	return err_ok;
}